

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

int hessian_opt(custom_function *funcpt,custom_gradient *funcgrad,double *x,int N,double *jac,
               double *dx,double eps,double eps2,double *H)

{
  int iVar1;
  
  if (funcgrad != (custom_gradient *)0x0) {
    hessian_fdg(funcgrad,x,N,jac,dx,eps2,H);
    return 0;
  }
  iVar1 = hessian_fd(funcpt,x,N,dx,eps,H);
  return iVar1;
}

Assistant:

int hessian_opt(custom_function *funcpt, custom_gradient *funcgrad, double *x, int N, double *jac,
		double *dx,double eps,double eps2,double *H) {
	int retval;
	retval = 0;
	if (funcgrad == NULL) {
		//printf("HESSF \n");
		retval = hessian_fd(funcpt,x,N,dx,eps,H);
	} else {
		//printf("HESSG \n");
		hessian_fdg(funcgrad,x,N,jac,dx,eps2,H);
	}

	return retval;
}